

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization_unpack.h
# Opt level: O1

void serialization::
     serialize_unpack<char_const*const*,serialization::json_oarchive,std::vector<Person,std::allocator<Person>>const&,std::optional<std::__cxx11::string>const&,std::map<std::__cxx11::string,Person,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Person>>>const&,std::vector<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>,std::allocator<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>const&>
               (char ***arg,json_oarchive *ar,vector<Person,_std::allocator<Person>_> *front,
               optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *next,map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Person>_>_>
                     *next_1,
               vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
               *next_2)

{
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  *this;
  char *pcVar1;
  pointer pPVar2;
  char **ppcVar3;
  size_t sVar4;
  Person *i;
  pointer this_00;
  
  pcVar1 = **arg;
  this = &ar->writer_;
  sVar4 = strlen(pcVar1);
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::String(this,pcVar1,(SizeType)sVar4,false);
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::StartArray(this);
  pPVar2 = (front->super__Vector_base<Person,_std::allocator<Person>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (this_00 = (front->super__Vector_base<Person,_std::allocator<Person>_>)._M_impl.
                 super__Vector_impl_data._M_start; this_00 != pPVar2; this_00 = this_00 + 1) {
    rapidjson::
    Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::StartObject(this);
    Person::serialize_impl<serialization::json_oarchive>(this_00,ar);
    rapidjson::
    Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::EndObject(this,0);
  }
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::EndArray(this,0);
  ppcVar3 = *arg;
  *arg = ppcVar3 + 1;
  if ((next->
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged == true) {
    pcVar1 = ppcVar3[1];
    sVar4 = strlen(pcVar1);
    rapidjson::
    Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::String(this,pcVar1,(SizeType)sVar4,false);
    rapidjson::
    Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ::String(this,(next->
                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                  )._M_payload.
                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ._M_payload._M_value._M_dataplus._M_p,
             *(SizeType *)
              ((long)&(next->
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      )._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload + 8),false);
  }
  ppcVar3 = *arg;
  *arg = ppcVar3 + 1;
  pcVar1 = ppcVar3[1];
  sVar4 = strlen(pcVar1);
  rapidjson::
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  ::String(this,pcVar1,(SizeType)sVar4,false);
  serialize_container_helper<serialization::json_oarchive,std::map<std::__cxx11::string,Person,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Person>>>>
            (ar,next_1);
  *arg = *arg + 1;
  serialize_unpack<char_const*const*&,serialization::json_oarchive,std::vector<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>,std::allocator<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>const&>
            (arg,ar,next_2);
  return;
}

Assistant:

inline void serialize_unpack(Argument && arg, Archive & ar, T && front, Args && ... next)
{
	serialization_trace trace(__func__, __FILE__, __LINE__);

    auto key = *arg;
    ar.save_key_start(key);
    serialize_helper(ar, front);
    ar.save_key_end(key);

    serialize_unpack(++arg, ar, std::forward<Args>(next)...);
}